

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepImageIO.cpp
# Opt level: O1

void Imf_3_2::loadDeepScanLineImage(string *fileName,Header *hdr,DeepImage *img)

{
  char *pcVar1;
  int iVar2;
  _Rb_tree_node_base *p_Var3;
  _Rb_tree_node_base *p_Var4;
  undefined8 uVar5;
  DeepImageLevel *this;
  iterator iVar6;
  Iterator IVar7;
  DeepScanLineInputFile in;
  DeepFrameBuffer fb;
  allocator<char> local_68 [56];
  undefined4 extraout_var;
  
  pcVar1 = (fileName->_M_dataplus)._M_p;
  iVar2 = Imf_3_2::globalThreadCount();
  Imf_3_2::DeepScanLineInputFile::DeepScanLineInputFile(&in,pcVar1,iVar2);
  Imf_3_2::DeepScanLineInputFile::header();
  Imf_3_2::Header::channels();
  Image::clearChannels(&img->super_Image);
  p_Var3 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::begin();
  while( true ) {
    p_Var4 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end();
    if (p_Var3 == p_Var4) break;
    std::__cxx11::string::string<std::allocator<char>>((string *)&fb,(char *)(p_Var3 + 1),local_68);
    Image::insertChannel(&img->super_Image,(string *)&fb,(Channel *)(p_Var3 + 9));
    if ((_Base_ptr *)fb._map._M_t._M_impl._0_8_ !=
        &fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)fb._map._M_t._M_impl._0_8_,
                      (ulong)((long)&(fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                                     )->_M_color + 1));
    }
    p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
  }
  Imf_3_2::DeepScanLineInputFile::header();
  uVar5 = Imf_3_2::Header::dataWindow();
  (*(img->super_Image)._vptr_Image[2])(img,uVar5,0);
  iVar2 = (*(img->super_Image)._vptr_Image[3])(img,0);
  this = (DeepImageLevel *)CONCAT44(extraout_var,iVar2);
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Imf_3_2::Slice::Slice(&fb._sampleCounts,HALF,(char *)0x0,0,0,1,1,0.0,false,false);
  SampleCountChannel::slice((SampleCountChannel *)local_68);
  Imf_3_2::DeepFrameBuffer::insertSampleCountSlice((Slice *)&fb);
  iVar6._M_node = (_Base_ptr)DeepImageLevel::begin(this);
  while( true ) {
    IVar7 = DeepImageLevel::end(this);
    if ((iterator)iVar6._M_node == IVar7._i._M_node) break;
    (**(code **)(**(long **)(iVar6._M_node + 2) + 0x20))(local_68);
    Imf_3_2::DeepFrameBuffer::insert((string *)&fb,(DeepSlice *)(iVar6._M_node + 1));
    iVar6._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar6._M_node);
  }
  Imf_3_2::DeepScanLineInputFile::setFrameBuffer((DeepFrameBuffer *)&in);
  SampleCountChannel::beginEdit(&this->_sampleCounts);
  Imf_3_2::DeepScanLineInputFile::readPixelSampleCounts
            ((int)&in,(this->super_ImageLevel)._dataWindow.min.y);
  SampleCountChannel::endEdit(&this->_sampleCounts);
  Imf_3_2::DeepScanLineInputFile::readPixels((int)&in,(this->super_ImageLevel)._dataWindow.min.y);
  Imf_3_2::DeepScanLineInputFile::header();
  p_Var3 = (_Rb_tree_node_base *)Imf_3_2::Header::begin();
  while( true ) {
    Imf_3_2::DeepScanLineInputFile::header();
    p_Var4 = (_Rb_tree_node_base *)Imf_3_2::Header::end();
    if (p_Var3 == p_Var4) break;
    iVar2 = strcmp((char *)(p_Var3 + 1),"tiles");
    if (iVar2 != 0) {
      Imf_3_2::Header::insert((char *)hdr,(Attribute *)(p_Var3 + 1));
    }
    p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
  }
  std::
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
               *)&fb);
  Imf_3_2::DeepScanLineInputFile::~DeepScanLineInputFile(&in);
  return;
}

Assistant:

void
loadDeepScanLineImage (const string& fileName, Header& hdr, DeepImage& img)
{
    DeepScanLineInputFile in (fileName.c_str ());

    const ChannelList& cl = in.header ().channels ();

    img.clearChannels ();

    for (ChannelList::ConstIterator i = cl.begin (); i != cl.end (); ++i)
        img.insertChannel (i.name (), i.channel ());

    img.resize (in.header ().dataWindow (), ONE_LEVEL, ROUND_DOWN);

    DeepImageLevel& level = img.level ();
    DeepFrameBuffer fb;

    fb.insertSampleCountSlice (level.sampleCounts ().slice ());

    for (DeepImageLevel::ConstIterator i = level.begin (); i != level.end ();
         ++i)
        fb.insert (i.name (), i.channel ().slice ());

    in.setFrameBuffer (fb);

    {
        SampleCountChannel::Edit edit (level.sampleCounts ());

        in.readPixelSampleCounts (
            level.dataWindow ().min.y, level.dataWindow ().max.y);
    }

    in.readPixels (level.dataWindow ().min.y, level.dataWindow ().max.y);

    for (Header::ConstIterator i = in.header ().begin ();
         i != in.header ().end ();
         ++i)
    {
        if (strcmp (i.name (), "tiles")) hdr.insert (i.name (), i.attribute ());
    }
}